

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O2

Var Js::JavascriptObject::DefinePropertiesHelperForProxyObjects
              (RecyclableObject *object,RecyclableObject *props,ScriptContext *scriptContext)

{
  uint uVar1;
  code *pcVar2;
  PropertyRecord *pPVar3;
  bool bVar4;
  int iVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  JavascriptArray *pJVar8;
  Recycler *this;
  undefined8 *puVar9;
  undefined4 extraout_var;
  Var pvVar10;
  PropertyRecord *pPVar11;
  long lVar12;
  PropertyId propertyId;
  long lVar13;
  ulong uVar14;
  ScriptContext *scriptContext_00;
  uint uVar15;
  undefined8 *puVar16;
  undefined1 local_a0 [8];
  TrackAllocData data;
  undefined8 *local_48;
  DescriptorMap *descriptors;
  PropertyRecord *propertyRecord;
  
  bVar4 = VarIsImpl<Js::JavascriptProxy>(props);
  propertyRecord = (PropertyRecord *)scriptContext;
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x7b8,"(VarIs<JavascriptProxy>(props))",
                                "VarIs<JavascriptProxy>(props)");
    if (!bVar4) {
LAB_00b93df6:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  pPVar3 = propertyRecord;
  pJVar8 = JavascriptOperators::GetOwnEnumerablePropertyNamesSymbols
                     (props,(ScriptContext *)propertyRecord);
  uVar1 = (pJVar8->super_ArrayObject).length;
  uVar14 = (ulong)uVar1;
  EnterPinnedScope(&local_48);
  local_a0 = (undefined1  [8])
             &DefinePropertiesHelperForProxyObjects(Js::RecyclableObject*,Js::RecyclableObject*,Js::ScriptContext*)
              ::DescriptorMap::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_7928bbe;
  data.filename._0_4_ = 0x7cb;
  data.plusSize = uVar14;
  this = Memory::Recycler::TrackAllocInfo
                   ((Recycler *)
                    pPVar3[0xc0].super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject,(TrackAllocData *)local_a0);
  if (uVar14 == 0) {
    Memory::Recycler::ClearTrackAllocInfo(this,(TrackAllocData *)0x0);
    puVar9 = (undefined8 *)0x8;
  }
  else {
    puVar9 = (undefined8 *)new__<Memory::Recycler>(uVar14 * 0x38,this,0x37ff80);
    puVar16 = puVar9;
    do {
      *puVar16 = 0;
      PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)(puVar16 + 1));
      puVar16 = puVar16 + 7;
    } while (puVar16 != puVar9 + uVar14 * 7);
  }
  descriptors = (DescriptorMap *)0x0;
  lVar12 = 0;
  local_48 = puVar9;
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  uVar15 = 0;
  scriptContext_00 = (ScriptContext *)propertyRecord;
  do {
    if (uVar1 == uVar15) {
      lVar13 = 8;
      while (bVar4 = lVar12 != 0, lVar12 = lVar12 + -1, bVar4) {
        DefineOwnPropertyHelper
                  (object,*(PropertyId *)(*(long *)((long)local_48 + lVar13 + -8) + 8),
                   (PropertyDescriptor *)((long)local_48 + lVar13),(ScriptContext *)propertyRecord,
                   true);
        lVar13 = lVar13 + 0x38;
      }
      LeavePinnedScope();
      return object;
    }
    PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_a0);
    iVar5 = (*(pJVar8->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x72])(pJVar8,(ulong)uVar15);
    pvVar10 = (Var)CONCAT44(extraout_var,iVar5);
    bVar4 = VarIs<Js::JavascriptSymbol>(pvVar10);
    if ((!bVar4) && (bVar4 = VarIs<Js::JavascriptString>(pvVar10), !bVar4)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                  ,0x7df,
                                  "(VarIs<JavascriptSymbol>(nextKey) || VarIs<JavascriptString>(nextKey))"
                                  ,
                                  "Invariant check during ownKeys proxy trap should make sure we only get property key here. (symbol or string primitives)"
                                 );
      if (!bVar4) goto LAB_00b93df6;
      *puVar7 = 0;
    }
    JavascriptConversion::ToPropertyKey
              (pvVar10,scriptContext_00,(PropertyRecord **)&descriptors,(PropertyString **)0x0);
    iVar5 = *(int *)&(descriptors->descriptor).Value.ptr;
    propertyId = iVar5;
    if (iVar5 == -1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                  ,0x7e2,"(propertyId != Constants::NoProperty)",
                                  "DefinePropertiesHelper - OwnPropertyKeys returned a propertyId with value NoProperty."
                                 );
      if (!bVar4) goto LAB_00b93df6;
      *puVar7 = 0;
      propertyId = *(PropertyId *)&(descriptors->descriptor).Value.ptr;
    }
    BVar6 = JavascriptOperators::GetOwnPropertyDescriptor
                      (props,propertyId,scriptContext_00,(PropertyDescriptor *)local_a0);
    if ((BVar6 != 0) &&
       (bVar4 = PropertyDescriptor::IsEnumerable((PropertyDescriptor *)local_a0), bVar4)) {
      pvVar10 = JavascriptOperators::GetProperty
                          (props,iVar5,scriptContext_00,(PropertyValueInfo *)0x0);
      BVar6 = JavascriptOperators::ToPropertyDescriptor
                        (pvVar10,(PropertyDescriptor *)(local_48 + lVar12 * 7 + 1),scriptContext_00)
      ;
      pPVar3 = propertyRecord;
      if (BVar6 == 0) {
        pPVar11 = ScriptContext::GetPropertyName((ScriptContext *)propertyRecord,iVar5);
        JavascriptError::ThrowTypeError((ScriptContext *)pPVar3,-0x7ff5ec2c,(PCWSTR)(pPVar11 + 1));
      }
      if (DAT_0145948b == '\x01') {
        ModifyGetterSetterFuncName
                  ((PropertyRecord *)descriptors,(PropertyDescriptor *)(local_48 + lVar12 * 7 + 1),
                   (ScriptContext *)propertyRecord);
      }
      Memory::WriteBarrierPtr<const_Js::PropertyRecord>::WriteBarrierSet
                ((WriteBarrierPtr<const_Js::PropertyRecord> *)(local_48 + lVar12 * 7),
                 (PropertyRecord *)descriptors);
      lVar12 = lVar12 + 1;
      scriptContext_00 = (ScriptContext *)propertyRecord;
    }
    uVar15 = uVar15 + 1;
  } while( true );
}

Assistant:

Var JavascriptObject::DefinePropertiesHelperForProxyObjects(RecyclableObject *object, RecyclableObject* props, ScriptContext *scriptContext)
{
    Assert(VarIs<JavascriptProxy>(props));

    //1.  If Type(O) is not Object throw a TypeError exception.
    //2.  Let props be ToObject(Properties).

    size_t descCount = 0;
    struct DescriptorMap
    {
        Field(PropertyRecord const *) propRecord;
        Field(PropertyDescriptor) descriptor;
    };

    //3.  Let keys be props.[[OwnPropertyKeys]]().
    //4.  ReturnIfAbrupt(keys).
    //5.  Let descriptors be an empty List.
    JavascriptArray* keys = JavascriptOperators::GetOwnEnumerablePropertyNamesSymbols(props, scriptContext);
    uint32 length = keys->GetLength();

    ENTER_PINNED_SCOPE(DescriptorMap, descriptors);
    descriptors = RecyclerNewArray(scriptContext->GetRecycler(), DescriptorMap, length);

    //6.  Repeat for each element nextKey of keys in List order,
    //    1.  Let propDesc be props.[[GetOwnProperty]](nextKey).
    //    2.  ReturnIfAbrupt(propDesc).
    //    3.  If propDesc is not undefined and propDesc.[[Enumerable]] is true, then
    //        1.  Let descObj be Get(props, nextKey).
    //        2.  ReturnIfAbrupt(descObj).
    //        3.  Let desc be ToPropertyDescriptor(descObj).
    //        4.  ReturnIfAbrupt(desc).
    //        5.  Append the pair(a two element List) consisting of nextKey and desc to the end of descriptors.
    Var nextKey;

    const PropertyRecord* propertyRecord = nullptr;
    PropertyId propertyId;
    Var descObj;
    for (uint32 j = 0; j < length; j++)
    {
        PropertyDescriptor propertyDescriptor;
        nextKey = keys->DirectGetItem(j);
        AssertMsg(VarIs<JavascriptSymbol>(nextKey) || VarIs<JavascriptString>(nextKey), "Invariant check during ownKeys proxy trap should make sure we only get property key here. (symbol or string primitives)");
        JavascriptConversion::ToPropertyKey(nextKey, scriptContext, &propertyRecord, nullptr);
        propertyId = propertyRecord->GetPropertyId();
        AssertMsg(propertyId != Constants::NoProperty, "DefinePropertiesHelper - OwnPropertyKeys returned a propertyId with value NoProperty.");

        if (JavascriptOperators::GetOwnPropertyDescriptor(props, propertyRecord->GetPropertyId(), scriptContext, &propertyDescriptor))
        {
            if (propertyDescriptor.IsEnumerable())
            {
                descObj = JavascriptOperators::GetProperty(props, propertyId, scriptContext);

                if (!JavascriptOperators::ToPropertyDescriptor(descObj, &descriptors[descCount].descriptor, scriptContext))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_PropertyDescriptor_Invalid, scriptContext->GetPropertyName(propertyId)->GetBuffer());
                }

                if (CONFIG_FLAG(UseFullName))
                {
                    ModifyGetterSetterFuncName(propertyRecord, descriptors[descCount].descriptor, scriptContext);
                }

                descriptors[descCount].propRecord = propertyRecord;

                descCount++;
            }
        }
    }

    //7.  For each pair from descriptors in list order,
    //    1.  Let P be the first element of pair.
    //    2.  Let desc be the second element of pair.
    //    3.  Let status be DefinePropertyOrThrow(O, P, desc).
    //    4.  ReturnIfAbrupt(status).

    for (size_t i = 0; i < descCount; i++)
    {
        DefineOwnPropertyHelper(object, descriptors[i].propRecord->GetPropertyId(), descriptors[i].descriptor, scriptContext);
    }

    LEAVE_PINNED_SCOPE();

    //8.  Return O.
    return object;
}